

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O1

bool isItRandom<GeneralHash<0,unsigned_int,unsigned_char>>(uint L)

{
  int k;
  undefined1 *puVar1;
  long lVar2;
  ostream *poVar3;
  uint k_1;
  value_type *__val;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  GeneralHash<0,_unsigned_int,_unsigned_char> hf;
  GeneralHash<0,_unsigned_int,_unsigned_char> base;
  GeneralHash<0,_unsigned_int,_unsigned_char> local_890;
  GeneralHash<0,_unsigned_int,_unsigned_char> local_460;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"checking that it is randomized ",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  puVar1 = (undefined1 *)operator_new(5);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 1) = 0;
  lVar2 = 0;
  do {
    puVar1[lVar2] = (char)lVar2;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  GeneralHash<0,_unsigned_int,_unsigned_char>::GeneralHash(&local_460,5,L);
  lVar2 = 0;
  uVar5 = 0;
  do {
    uVar4 = local_460.irreduciblepoly;
    if ((local_460.lastbit & ~(uVar5 * 2)) != 0) {
      uVar4 = 0;
    }
    uVar5 = uVar4 ^ local_460.hasher.hashvalues[(byte)puVar1[lVar2]] ^ uVar5 * 2;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  uVar4 = 0;
  bVar8 = true;
  do {
    GeneralHash<0,_unsigned_int,_unsigned_char>::GeneralHash(&local_890,5,L);
    lVar2 = 0;
    uVar7 = 0;
    do {
      uVar6 = local_890.irreduciblepoly;
      if ((local_890.lastbit & ~(uVar7 * 2)) != 0) {
        uVar6 = 0;
      }
      uVar7 = uVar6 ^ local_890.hasher.hashvalues[(byte)puVar1[lVar2]] ^ uVar7 * 2;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 5);
    if (uVar7 == uVar5) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"collision ",10);
      poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"It is randomized! ",0x12);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      poVar3 = (ostream *)&std::cout;
    }
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (local_890.precomputedshift.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_890.precomputedshift.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (uVar7 != uVar5) goto LAB_00107c88;
    bVar8 = uVar4 < 99;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not randomized! ",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
LAB_00107c88:
  if (local_460.precomputedshift.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_460.precomputedshift.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete(puVar1);
  return bVar8;
}

Assistant:

bool isItRandom(uint L = 19) {
  cout << "checking that it is randomized " << endl;
  int n = 5;
  vector<unsigned char> data(n);
  for (int k = 0; k < n; ++k) {
    data[k] = static_cast<unsigned char>(k);
  }
  hashfunction base(n, L);
  uint64 x = base.hash(data);
  for (int k = 0; k < 100; ++k) {
    hashfunction hf(n, L);
    uint64 y = hf.hash(data);
    if (y != x) {
      cout << "It is randomized! " << endl;
      return true;
    }
    cout << "collision " << y << endl;
  }
  cout << "Not randomized! " << endl;
  return false; // we conclude that it always hashes to the same value (this is
                // bad)
}